

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::EventContext::EventContext
          (EventContext *this,TracePacketHandle *trace_packet,
          TrackEventIncrementalState *incremental_state,TrackEventTlsState *tls_state)

{
  TracePacket *this_00;
  TrackEvent *pTVar1;
  TrackEventTlsState *tls_state_local;
  TrackEventIncrementalState *incremental_state_local;
  TracePacketHandle *trace_packet_local;
  EventContext *this_local;
  
  protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::MessageHandle
            (&this->trace_packet_,trace_packet);
  this_00 = protozero::MessageHandle<perfetto::protos::pbzero::TracePacket>::operator->
                      (&this->trace_packet_);
  pTVar1 = protos::pbzero::TracePacket::set_track_event<perfetto::protos::pbzero::TrackEvent>
                     (this_00);
  this->event_ = pTVar1;
  this->incremental_state_ = incremental_state;
  this->tls_state_ = tls_state;
  return;
}

Assistant:

EventContext::EventContext(
    EventContext::TracePacketHandle trace_packet,
    internal::TrackEventIncrementalState* incremental_state,
    const internal::TrackEventTlsState* tls_state)
    : trace_packet_(std::move(trace_packet)),
      event_(trace_packet_->set_track_event()),
      incremental_state_(incremental_state),
      tls_state_(tls_state) {}